

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

BOOL Js::JavascriptOperators::HasOwnPropertyNoHostObject(Var instance,PropertyId propertyId)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  undefined4 *puVar4;
  RecyclableObject *pRVar5;
  bool local_21;
  RecyclableObject *object;
  PropertyId propertyId_local;
  Var instance_local;
  
  bVar2 = TaggedNumber::Is(instance);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x6bd,"(!TaggedNumber::Is(instance))",
                                "HasOwnPropertyNoHostObject int passed");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  pRVar5 = VarTo<Js::RecyclableObject>(instance);
  local_21 = false;
  if (pRVar5 != (RecyclableObject *)0x0) {
    iVar3 = (*(pRVar5->super_FinalizableObject).super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0xd])(pRVar5,(ulong)(uint)propertyId);
    local_21 = iVar3 != 0;
  }
  return (BOOL)local_21;
}

Assistant:

BOOL JavascriptOperators::HasOwnPropertyNoHostObject(Var instance, PropertyId propertyId)
    {
        AssertMsg(!TaggedNumber::Is(instance), "HasOwnPropertyNoHostObject int passed");

        RecyclableObject* object = VarTo<RecyclableObject>(instance);
        return object && object->HasOwnPropertyNoHostObject(propertyId);
    }